

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall
spoa::Graph::AddAlignment
          (Graph *this,Alignment *alignment,char *sequence,uint32_t sequence_len,char *quality,
          uint32_t quality_len)

{
  int local_58;
  uint local_54;
  undefined1 local_50 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> weights;
  uint32_t quality_len_local;
  char *quality_local;
  uint32_t sequence_len_local;
  char *sequence_local;
  Alignment *alignment_local;
  Graph *this_local;
  
  weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = quality_len;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  for (local_54 = 0;
      local_54 <
      weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; local_54 = local_54 + 1) {
    local_58 = quality[local_54] + -0x21;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,&local_58);
  }
  AddAlignment(this,alignment,sequence,sequence_len,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  return;
}

Assistant:

void Graph::AddAlignment(
    const Alignment& alignment,
    const char* sequence, std::uint32_t sequence_len,
    const char* quality, std::uint32_t quality_len) {
  std::vector<std::uint32_t> weights;
  for (std::uint32_t i = 0; i < quality_len; ++i) {
    weights.emplace_back(quality[i] - 33);  // Phred quality
  }
  AddAlignment(alignment, sequence, sequence_len, weights);
}